

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::JobManager::PrepareJobs
          (Error *__return_storage_ptr__,JobManager *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids,bool aGroupAlias)

{
  uint64_t uVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  bool bVar2;
  uint uVar3;
  const_reference pvVar4;
  pointer ppVar5;
  element_type *peVar6;
  ulong uVar7;
  string *psVar8;
  Error *aError;
  ErrorCode local_20c;
  Error local_208;
  int local_1dc;
  string local_1d8;
  Error local_1b8;
  undefined1 local_190 [8];
  Error importError;
  Expression jobExpr;
  string local_148;
  byte local_123;
  undefined1 local_122;
  allocator local_121;
  undefined1 local_120 [5];
  bool active;
  bool isInactiveAllowed;
  _Self local_100;
  _Self local_f8;
  iterator entry;
  unsigned_long *nid;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  string local_a8;
  Error local_88;
  string local_50;
  byte local_2a;
  byte local_29;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvStack_28;
  bool aGroupAlias_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids_local;
  Expression *aExpr_local;
  JobManager *this_local;
  Error *error;
  
  local_2a = 0;
  local_29 = aGroupAlias;
  pvStack_28 = aNids;
  aNids_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)aExpr;
  aExpr_local = (Expression *)this;
  this_local = (JobManager *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)aNids_local,0);
  utils::ToLower(&local_50,pvVar4);
  bVar2 = std::operator==(&local_50,"start");
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar2) {
    PrepareStartJobs(&local_88,this,(Expression *)aNids_local,pvStack_28,(bool)(local_29 & 1));
    Error::operator=(__return_storage_ptr__,&local_88);
    Error::~Error(&local_88);
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)aNids_local,0);
    utils::ToLower(&local_a8,pvVar4);
    bVar2 = std::operator==(&local_a8,"stop");
    std::__cxx11::string::~string((string *)&local_a8);
    this_00 = pvStack_28;
    if (bVar2) {
      PrepareStopJobs((Error *)&__range2,this,(Expression *)aNids_local,pvStack_28,
                      (bool)(local_29 & 1));
      Error::operator=(__return_storage_ptr__,(Error *)&__range2);
      Error::~Error((Error *)&__range2);
    }
    else {
      __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvStack_28);
      nid = (unsigned_long *)
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)&nid), bVar2) {
        entry._M_node =
             (_Base_ptr)
             __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end2);
        local_f8._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
             ::find(&this->mCommissionerPool,(key_type *)entry._M_node);
        local_100._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
             ::end(&this->mCommissionerPool);
        bVar2 = std::operator==(&local_f8,&local_100);
        if (bVar2) {
          if ((local_29 & 1) == 0) {
            uVar1 = *(uint64_t *)entry._M_node;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)local_120,"not started",&local_121);
            WarningMsg(this,uVar1,(string *)local_120);
            std::__cxx11::string::~string((string *)local_120);
            std::allocator<char>::~allocator((allocator<char> *)&local_121);
          }
        }
        else {
          local_122 = Interpreter::IsInactiveCommissionerAllowed
                                (this->mInterpreter,(Expression *)aNids_local);
          if (!(bool)local_122) {
            ppVar5 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>
                     ::operator->(&local_f8);
            peVar6 = std::
                     __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&ppVar5->second);
            uVar3 = (*(peVar6->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
            local_123 = (byte)uVar3 & 1;
            if ((uVar3 & 1) == 0) {
              if ((local_29 & 1) == 0) {
                uVar1 = *(uint64_t *)entry._M_node;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_148,"not started",
                           (allocator *)
                           ((long)&jobExpr.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                WarningMsg(this,uVar1,&local_148);
                std::__cxx11::string::~string((string *)&local_148);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&jobExpr.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              }
              goto LAB_001b777d;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&importError.mMessage.field_2 + 8),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)aNids_local);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            AppendImport((Error *)local_190,this,*(uint64_t *)entry._M_node,
                         (Expression *)((long)&importError.mMessage.field_2 + 8));
            Error::Error(&local_1b8);
            bVar2 = Error::operator!=((Error *)local_190,&local_1b8);
            Error::~Error(&local_1b8);
            if (bVar2) {
              uVar1 = *(uint64_t *)entry._M_node;
              psVar8 = Error::GetMessage_abi_cxx11_((Error *)local_190);
              std::__cxx11::string::string((string *)&local_1d8,(string *)psVar8);
              ErrorMsg(this,uVar1,&local_1d8);
              std::__cxx11::string::~string((string *)&local_1d8);
              local_1dc = 8;
            }
            else {
              local_1dc = 0;
            }
            Error::~Error((Error *)local_190);
            if (local_1dc == 0) goto LAB_001b7688;
          }
          else {
LAB_001b7688:
            ppVar5 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>
                     ::operator->(&local_f8);
            CreateJob(&local_208,this,&ppVar5->second,
                      (Expression *)((long)&importError.mMessage.field_2 + 8),
                      *(uint64_t *)entry._M_node);
            aError = Error::operator=(__return_storage_ptr__,&local_208);
            local_20c = kNone;
            bVar2 = commissioner::operator!=(aError,&local_20c);
            Error::~Error(&local_208);
            if (bVar2) {
              local_1dc = 4;
            }
            else {
              local_1dc = 0;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&importError.mMessage.field_2 + 8));
          if (local_1dc != 0) {
            if (local_1dc == 4) break;
            if (local_1dc != 8) goto LAB_001b77ac;
          }
        }
LAB_001b777d:
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end2);
      }
    }
  }
  local_2a = 1;
  local_1dc = 1;
LAB_001b77ac:
  if ((local_2a & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::PrepareJobs(const Interpreter::Expression &aExpr,
                              const std::vector<uint64_t>   &aNids,
                              bool                           aGroupAlias)
{
    Error error;

    if (utils::ToLower(aExpr[0]) == "start")
    {
        ExitNow(error = PrepareStartJobs(aExpr, aNids, aGroupAlias));
    }
    else if (utils::ToLower(aExpr[0]) == "stop")
    {
        ExitNow(error = PrepareStopJobs(aExpr, aNids, aGroupAlias));
    }

    for (const auto &nid : aNids)
    {
        auto entry = mCommissionerPool.find(nid);
        if (entry == mCommissionerPool.end())
        {
            if (!aGroupAlias)
            {
                WarningMsg(nid, "not started");
            }
            continue;
        }

        bool isInactiveAllowed = mInterpreter.IsInactiveCommissionerAllowed(aExpr);
        if (!isInactiveAllowed)
        {
            bool active = entry->second->IsActive();
            if (!active)
            {
                if (!aGroupAlias)
                {
                    WarningMsg(nid, "not started");
                }
                continue;
            }
        }

        Interpreter::Expression jobExpr = aExpr;

        if (!mImportFile.empty())
        {
            Error importError = AppendImport(nid, jobExpr);
            if (importError != ERROR_NONE)
            {
                ErrorMsg(nid, importError.GetMessage());
                continue;
            }
        }

        SuccessOrExit(error = CreateJob(entry->second, jobExpr, nid));
    }

exit:
    return error;
}